

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::next(Session *this,string *msg,UtcTimeStamp *timeStamp,bool queued)

{
  DataDictionary *dataDictionary;
  DataDictionary *applicationDataDictionary;
  Message local_188;
  
  SessionState::onIncoming(&this->m_state,msg);
  dataDictionary =
       DataDictionaryProvider::getSessionDataDictionary
                 (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
  if ((this->m_sessionID).m_isFIXT == true) {
    ApplVerID::ApplVerID((ApplVerID *)&local_188,&this->m_senderDefaultApplVerID);
    applicationDataDictionary =
         DataDictionaryProvider::getApplicationDataDictionary
                   (&this->m_dataDictionaryProvider,(ApplVerID *)&local_188);
    FieldBase::~FieldBase((FieldBase *)&local_188);
    Message::Message(&local_188,msg,dataDictionary,applicationDataDictionary,
                     this->m_validateLengthAndChecksum);
    next(this,&local_188,timeStamp,queued);
  }
  else {
    Message::Message(&local_188,msg,dataDictionary,this->m_validateLengthAndChecksum);
    next(this,&local_188,timeStamp,queued);
  }
  Message::~Message(&local_188);
  return;
}

Assistant:

void Session::next( const std::string& msg, const UtcTimeStamp& timeStamp, bool queued )
{
  try
  {
    m_state.onIncoming( msg );
    const DataDictionary& sessionDD = 
      m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if( m_sessionID.isFIXT() )
    {
      const DataDictionary& applicationDD =
        m_dataDictionaryProvider.getApplicationDataDictionary(m_senderDefaultApplVerID);
      next( Message( msg, sessionDD, applicationDD, m_validateLengthAndChecksum ), timeStamp, queued );
    }
    else
    {
      next( Message( msg, sessionDD, m_validateLengthAndChecksum ), timeStamp, queued );
    }
  }
  catch( InvalidMessage& e )
  {
    m_state.onEvent( e.what() );

    try
    {
      if( identifyType(msg) == MsgType_Logon )
      {
        m_state.onEvent( "Logon message is not valid" );
        disconnect();
      }
    } catch( MessageParseError& ) {}
    throw e;
  }
}